

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::CreateTar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format,
               int compressionLevel)

{
  pointer pcVar1;
  archive *paVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  pointer pbVar6;
  Compress c;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string cwd;
  cmArchiveWrite a;
  ofstream fout;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  undefined1 local_310 [32];
  _Alloc_hider local_2f0;
  char *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  string local_2b0 [128];
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  GetCurrentWorkingDirectory_abi_cxx11_();
  std::ofstream::ofstream(&local_230,(outFileName->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    c = CompressNone;
    if (compressType < TarCompressNone) {
      c = *(Compress *)(&DAT_002620f0 + (ulong)compressType * 4);
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    if (format->_M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"paxr","");
    }
    else {
      pcVar1 = (format->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390,pcVar1,pcVar1 + format->_M_string_length);
    }
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_310,(ostream *)&local_230,c,&local_390,compressionLevel,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    bVar4 = cmArchiveWrite::Open((cmArchiveWrite *)local_310);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)(local_310 + 0x60));
      local_310[0x18] = verbose;
      pbVar6 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar4 = true;
      if (pbVar6 != pbVar3) {
        do {
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          pcVar1 = (pbVar6->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_390,pcVar1,pcVar1 + pbVar6->_M_string_length);
          bVar5 = cmsys::SystemTools::FileIsFullPath(&local_390);
          if (bVar5) {
            RelativePath(&local_370,&local_330,&local_390);
            std::__cxx11::string::operator=((string *)&local_390,(string *)&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != &local_370.field_2) {
              operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_350,local_390._M_dataplus._M_p,
                     local_390._M_dataplus._M_p + local_390._M_string_length);
          bVar5 = cmArchiveWrite::Add((cmArchiveWrite *)local_310,&local_350,0,(char *)0x0,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
          }
          if (!bVar5) {
            local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_370,local_2d0._M_p,local_2d0._M_p + local_2c8);
            Error(&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != &local_370.field_2) {
              operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1
                             );
            }
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != pbVar3);
      }
    }
    else {
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390,local_2d0._M_p,local_2d0._M_p + local_2c8);
      Error(&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      bVar4 = false;
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_310);
  }
  else {
    pcVar1 = (outFileName->_M_dataplus)._M_p;
    paVar2 = (archive *)outFileName->_M_string_length;
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    local_310._0_8_ = (ostream *)0x19;
    local_310._8_8_ = "Cannot open output file \"";
    local_2f0._M_p = (pointer)0x3;
    local_2e8 = "\": ";
    local_2e0._M_allocated_capacity = local_370._M_string_length;
    local_2e0._8_8_ = local_370._M_dataplus._M_p;
    views._M_len = 4;
    views._M_array = (iterator)local_310;
    local_310._16_8_ = paVar2;
    local_310._24_8_ = pcVar1;
    cmCatViews_abi_cxx11_(&local_390,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    Error(&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _vtable;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmSystemTools::CreateTar(const std::string& outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format, int compressionLevel)
{
#if !defined(CMAKE_BOOTSTRAP)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName.c_str(), std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = cmStrCat("Cannot open output file \"", outFileName,
                             "\": ", cmSystemTools::GetLastSystemError());
    cmSystemTools::Error(e);
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressZstd:
      compress = cmArchiveWrite::CompressZstd;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format,
                   compressionLevel);

  if (!a.Open()) {
    cmSystemTools::Error(a.GetError());
    return false;
  }
  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  bool tarCreatedSuccessfully = true;
  for (auto path : files) {
    if (cmSystemTools::FileIsFullPath(path)) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd, path);
    }
    if (!a.Add(path)) {
      cmSystemTools::Error(a.GetError());
      tarCreatedSuccessfully = false;
    }
  }
  return tarCreatedSuccessfully;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}